

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void runtest(int n,char *filename1,char *arg2)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  long *plVar5;
  ostream *poVar6;
  FILE *__stream;
  runtime_error *this;
  size_type *psVar7;
  _Base_ptr p_Var8;
  _Base_ptr *pp_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  initializer_list<int> __l;
  initializer_list<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_> __l_00;
  QPDF pdf;
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  test_functions;
  shared_ptr<char> file_buf;
  size_t size;
  set<int,_std::less<int>,_std::allocator<int>_> ignore_filename;
  string password;
  QPDF aQStack_748 [15];
  allocator<char> local_739;
  undefined1 local_738 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_730;
  _Base_ptr local_728;
  _Base_ptr p_Stack_720;
  ulong local_708;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  undefined8 local_668;
  
  local_688.field_2._M_allocated_capacity = 0x5600000055;
  local_688.field_2._8_8_ = 0x5c00000057;
  local_688._M_dataplus._M_p = (pointer)0x510000003d;
  local_688._M_string_length = 0x5400000053;
  local_668 = 0x600000005f;
  __l._M_len = 10;
  __l._M_array = (iterator)&local_688;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_6b8,__l,(less<int> *)local_738
             ,(allocator_type *)&local_6f8);
  if (n == 0) {
    local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_688,anon_var_dwarf_17bc7,anon_var_dwarf_17bc7 + 0x20);
    if (local_688._M_string_length != 0x20) {
      __assert_fail("password.length() == 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xdff,"void runtest(int, const char *, const char *)");
    }
    QPDF::trim_user_password((string *)&local_688);
    iVar3 = std::__cxx11::string::compare((char *)&local_688);
    if (iVar3 != 0) {
      __assert_fail("password == \"1234567890123456789012(45678\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe01,"void runtest(int, const char *, const char *)");
    }
    local_738 = (undefined1  [8])0x0;
    p_Stack_730 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar3 = QPDFObjectHandle::getTypeCode();
    if (iVar3 != 0) {
      __assert_fail("uninitialized.getTypeCode() == ::ot_uninitialized",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe04,"void runtest(int, const char *, const char *)");
    }
    pcVar4 = (char *)QPDFObjectHandle::getTypeName();
    iVar3 = strcmp(pcVar4,"uninitialized");
    if (iVar3 != 0) {
      __assert_fail("strcmp(uninitialized.getTypeName(), \"uninitialized\") == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe05,"void runtest(int, const char *, const char *)");
    }
    if (p_Stack_730 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_730);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_dataplus._M_p != &local_688.field_2) {
      operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
    }
  }
  QPDF::QPDF(aQStack_748);
  local_708 = 0;
  p_Stack_700 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (n == 0) {
    QPDF::setAttemptRecovery(SUB81(aQStack_748,0));
  }
  if (arg2 == (char *)0x0 || 1 < n - 0x23U) {
    if (n == 0x2d) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_738,filename1,(allocator<char> *)&local_6f8);
      plVar5 = (long *)std::__cxx11::string::append(local_738);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_688.field_2._M_allocated_capacity = *psVar7;
        local_688.field_2._8_8_ = plVar5[3];
        local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
      }
      else {
        local_688.field_2._M_allocated_capacity = *psVar7;
        local_688._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_688._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_738 != (undefined1  [8])&local_728) {
        operator_delete((void *)local_738,(ulong)((long)&local_728->_M_color + 1));
      }
      local_6d8._M_dataplus._M_p = (char *)0x0;
      QUtil::read_file_into_memory
                (local_688._M_dataplus._M_p,(shared_ptr *)&local_708,(ulong *)&local_6d8);
      uVar2 = local_708;
      if (local_6d8._M_dataplus._M_p != (char *)0x0) {
        pcVar4 = (char *)0x0;
        do {
          pcVar4[local_708] = pcVar4[local_708] ^ 0xcc;
          pcVar4 = pcVar4 + 1;
        } while (pcVar4 < local_6d8._M_dataplus._M_p);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,filename1,&local_739);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_6f8);
      pp_Var9 = (_Base_ptr *)(plVar5 + 2);
      if ((_Base_ptr *)*plVar5 == pp_Var9) {
        local_728 = *pp_Var9;
        p_Stack_720 = (_Base_ptr)plVar5[3];
        local_738 = (undefined1  [8])&local_728;
      }
      else {
        local_728 = *pp_Var9;
        local_738 = (undefined1  [8])*plVar5;
      }
      p_Stack_730 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
      *plVar5 = (long)pp_Var9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      QPDF::processMemoryFile
                ((char *)aQStack_748,(char *)local_738,uVar2,local_6d8._M_dataplus._M_p);
      if (local_738 != (undefined1  [8])&local_728) {
        operator_delete((void *)local_738,(ulong)((long)&local_728->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_688._M_dataplus._M_p != &local_688.field_2) {
LAB_001137e5:
        operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      p_Var1 = &local_6b8._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)local_6b8._M_impl.super__Rb_tree_header._M_header._M_parent !=
             (_Rb_tree_header *)0x0;
          local_6b8._M_impl.super__Rb_tree_header._M_header._M_parent =
               (&(local_6b8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
               [(int)*(size_t *)(local_6b8._M_impl.super__Rb_tree_header._M_header._M_parent + 1) <
                n]) {
        if (n <= (int)*(size_t *)(local_6b8._M_impl.super__Rb_tree_header._M_header._M_parent + 1))
        {
          p_Var8 = local_6b8._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
      }
      p_Var11 = p_Var1;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var11 = (_Rb_tree_header *)p_Var8, n < (int)((_Rb_tree_header *)p_Var8)->_M_node_count))
      {
        p_Var11 = p_Var1;
      }
      if (p_Var11 == p_Var1) {
        if (n == 0x59) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_688,filename1,(allocator<char> *)local_738);
          QPDF::createFromJSON((string *)aQStack_748);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688._M_dataplus._M_p != &local_688.field_2) goto LAB_001137e5;
        }
        else {
          if ((n & 1U) == 0) {
            if ((n & 2U) == 0) {
              __stream = (FILE *)0x0;
              QPDF::processFile((char *)aQStack_748,filename1);
            }
            else {
              __stream = (FILE *)QUtil::safe_fopen(filename1,"rb");
              QPDF::processFile((char *)aQStack_748,(_IO_FILE *)filename1,SUB81(__stream,0),
                                (char *)0x0);
            }
            goto LAB_001137f8;
          }
          local_688._M_dataplus._M_p = (pointer)0x0;
          QUtil::read_file_into_memory(filename1,(shared_ptr *)&local_708,(ulong *)&local_688);
          QPDF::processMemoryFile
                    ((char *)aQStack_748,filename1,local_708,local_688._M_dataplus._M_p);
        }
      }
    }
  }
  else {
    QPDF::processFile((char *)aQStack_748,filename1);
  }
  __stream = (FILE *)0x0;
LAB_001137f8:
  memcpy(&local_688,&DAT_00159070,0x650);
  __l_00._M_len = 0x65;
  __l_00._M_array = (iterator)&local_688;
  std::
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  ::map((map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
         *)local_738,__l_00,(less<int> *)&local_6f8,(allocator_type *)&local_6d8);
  p_Var10 = (_Base_ptr)&p_Stack_730;
  for (p_Var8 = local_728; p_Var8 != (_Base_ptr)0x0;
      p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < n]) {
    if (n <= (int)p_Var8[1]._M_color) {
      p_Var10 = p_Var8;
    }
  }
  p_Var8 = (_Base_ptr)&p_Stack_730;
  if ((p_Var10 != (_Base_ptr)&p_Stack_730) && (p_Var8 = p_Var10, n < (int)p_Var10[1]._M_color)) {
    p_Var8 = (_Base_ptr)&p_Stack_730;
  }
  if (p_Var8 != (_Base_ptr)&p_Stack_730) {
    (*(code *)p_Var8[1]._M_parent)(aQStack_748,arg2);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"test ",5);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,n);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," done",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::
    _Rb_tree<int,_std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>,_std::_Select1st<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>,_std::_Select1st<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
                 *)local_738);
    if (p_Stack_700 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_700);
    }
    QPDF::~QPDF(aQStack_748);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_6b8);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"invalid test ","");
  QUtil::int_to_string_abi_cxx11_((longlong)&local_6d8,n);
  std::operator+(&local_688,&local_6f8,&local_6d8);
  std::runtime_error::runtime_error(this,(string *)&local_688);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
runtest(int n, char const* filename1, char const* arg2)
{
    // Most tests here are crafted to work on specific files.  Look at
    // the test suite to see how the test is invoked to find the file
    // that the test is supposed to operate on.

    std::set<int> ignore_filename = {61, 81, 83, 84, 85, 86, 87, 92, 95, 96};

    if (n == 0) {
        // Throw in some random test cases that don't fit anywhere
        // else.  This is in addition to whatever else is going on in
        // test 0.

        // The code to trim user passwords looks for 0x28 (which is
        // "(") since it marks the beginning of the padding.  Exercise
        // the code to make sure it skips over 0x28 characters that
        // aren't part of padding.
        std::string password("1234567890123456789012(45678\x28\xbf\x4e\x5e");
        assert(password.length() == 32);
        QPDF::trim_user_password(password);
        assert(password == "1234567890123456789012(45678");

        QPDFObjectHandle uninitialized;
        assert(uninitialized.getTypeCode() == ::ot_uninitialized);
        assert(strcmp(uninitialized.getTypeName(), "uninitialized") == 0);
    }

    QPDF pdf;
    std::shared_ptr<char> file_buf;
    FILE* filep = nullptr;
    if (n == 0) {
        pdf.setAttemptRecovery(false);
    }
    if (((n == 35) || (n == 36)) && (arg2 != nullptr)) {
        // arg2 is password
        pdf.processFile(filename1, arg2);
    } else if (n == 45) {
        // Decode obfuscated files. To obfuscated, run the input file
        // through this perl script, and save the result to
        // filename.obfuscated. This pretends that the input was
        // called filename.pdf and that that file contained the
        // deobfuscated version.

        // undef $/;
        // my @str = split('', <STDIN>);
        // for (my $i = 0; $i < scalar(@str); ++$i)
        // {
        //     $str[$i] = chr(ord($str[$i]) ^ 0xcc);
        // }
        // print(join('', @str));

        std::string filename(std::string(filename1) + ".obfuscated");
        size_t size = 0;
        QUtil::read_file_into_memory(filename.c_str(), file_buf, size);
        char* p = file_buf.get();
        for (size_t i = 0; i < size; ++i) {
            p[i] = static_cast<char>(p[i] ^ 0xcc);
        }
        pdf.processMemoryFile((std::string(filename1) + ".pdf").c_str(), p, size);
    } else if (ignore_filename.count(n)) {
        // Ignore filename argument entirely
    } else if (n == 89) {
        pdf.createFromJSON(filename1);
    } else if (n % 2 == 0) {
        if (n % 4 == 0) {
            QTC::TC("qpdf", "exercise processFile(name)");
            pdf.processFile(filename1);
        } else {
            QTC::TC("qpdf", "exercise processFile(FILE*)");
            filep = QUtil::safe_fopen(filename1, "rb");
            pdf.processFile(filename1, filep, false);
        }
    } else {
        QTC::TC("qpdf", "exercise processMemoryFile");
        size_t size = 0;
        QUtil::read_file_into_memory(filename1, file_buf, size);
        pdf.processMemoryFile(filename1, file_buf.get(), size);
    }

    std::map<int, void (*)(QPDF&, char const*)> test_functions = {
        {0, test_0_1}, {1, test_0_1}, {2, test_2},   {3, test_3},   {4, test_4},    {5, test_5},
        {6, test_6},   {7, test_7},   {8, test_8},   {9, test_9},   {10, test_10},  {11, test_11},
        {12, test_12}, {13, test_13}, {14, test_14}, {15, test_15}, {16, test_16},  {17, test_17},
        {18, test_18}, {19, test_19}, {20, test_20}, {21, test_21}, {22, test_22},  {23, test_23},
        {24, test_24}, {25, test_25}, {26, test_26}, {27, test_27}, {28, test_28},  {29, test_29},
        {30, test_30}, {31, test_31}, {32, test_32}, {33, test_33}, {34, test_34},  {35, test_35},
        {36, test_36}, {37, test_37}, {38, test_38}, {39, test_39}, {40, test_40},  {41, test_41},
        {42, test_42}, {43, test_43}, {44, test_44}, {45, test_45}, {46, test_46},  {47, test_47},
        {48, test_48}, {49, test_49}, {50, test_50}, {51, test_51}, {52, test_52},  {53, test_53},
        {54, test_54}, {55, test_55}, {56, test_56}, {57, test_57}, {58, test_58},  {59, test_59},
        {60, test_60}, {61, test_61}, {62, test_62}, {63, test_63}, {64, test_64},  {65, test_65},
        {66, test_66}, {67, test_67}, {68, test_68}, {69, test_69}, {70, test_70},  {71, test_71},
        {72, test_72}, {73, test_73}, {74, test_74}, {75, test_75}, {76, test_76},  {77, test_77},
        {78, test_78}, {79, test_79}, {80, test_80}, {81, test_81}, {82, test_82},  {83, test_83},
        {84, test_84}, {85, test_85}, {86, test_86}, {87, test_87}, {88, test_88},  {89, test_89},
        {90, test_90}, {91, test_91}, {92, test_92}, {93, test_93}, {94, test_94},  {95, test_95},
        {96, test_96}, {97, test_97}, {98, test_98}, {99, test_99}, {100, test_100}};

    auto fn = test_functions.find(n);
    if (fn == test_functions.end()) {
        throw std::runtime_error(std::string("invalid test ") + QUtil::int_to_string(n));
    }
    (fn->second)(pdf, arg2);

    if (filep) {
        fclose(filep);
    }
    std::cout << "test " << n << " done" << std::endl;
}